

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonehash.cpp
# Opt level: O2

ZoneHashNode * __thiscall
asmjit::ZoneHashBase::_remove(ZoneHashBase *this,ZoneAllocator *allocator,ZoneHashNode *node)

{
  ZoneHashNode *pZVar1;
  ZoneHashNode *pZVar2;
  
  pZVar1 = (ZoneHashNode *)
           (this->_data +
           (*(uint *)(node + 8) -
           (int)((ulong)this->_rcpValue * (ulong)*(uint *)(node + 8) >> (this->_rcpShift & 0x3f)) *
           this->_bucketsCount));
  do {
    pZVar2 = pZVar1;
    pZVar1 = *(ZoneHashNode **)pZVar2;
    if (pZVar1 == (ZoneHashNode *)0x0) {
      return (ZoneHashNode *)0x0;
    }
  } while (pZVar1 != node);
  *(long *)pZVar2 = *(long *)pZVar1;
  this->_size = this->_size - 1;
  return node;
}

Assistant:

ZoneHashNode* ZoneHashBase::_remove(ZoneAllocator* allocator, ZoneHashNode* node) noexcept {
  DebugUtils::unused(allocator);
  uint32_t hashMod = _calcMod(node->_hashCode);

  ZoneHashNode** pPrev = &_data[hashMod];
  ZoneHashNode* p = *pPrev;

  while (p) {
    if (p == node) {
      *pPrev = p->_hashNext;
      _size--;
      return node;
    }

    pPrev = &p->_hashNext;
    p = *pPrev;
  }

  return nullptr;
}